

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O3

shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
 __thiscall
SimpleWeb::
ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::request(ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
          *this,string *request_type,string *path,ostream *content,
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *header)

{
  io_service *this_00;
  int iVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar2;
  long lVar3;
  _func_int **pp_Var4;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s;
  error_category *peVar5;
  basic_streambuf_ref<std::allocator<char>_> bVar6;
  _Alloc_hider _Var7;
  undefined1 auVar8 [8];
  uint uVar9;
  char cVar10;
  int iVar11;
  ulong __val;
  ostream *poVar12;
  _Rb_tree_node_base *p_Var13;
  size_t sVar14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  element_type *__p;
  ulonglong uVar17;
  int *piVar18;
  ulong uVar19;
  element_type *peVar20;
  transfer_exactly_t completion_condition;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  uint __len;
  long in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  istream *piVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  bool bVar24;
  shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
  sVar25;
  string_view delim;
  string_view delim_00;
  string line;
  string corrected_path;
  string buffer;
  string __str;
  ostream response_content_output_stream;
  streambuf streambuf;
  streambuf write_buffer;
  ostream write_stream;
  undefined8 local_4c0;
  error_category *local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  undefined8 local_4a0;
  error_category *local_498;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_490;
  element_type *local_488;
  long *local_480;
  char *local_478;
  long local_470 [2];
  basic_streambuf_ref<std::allocator<char>_> local_460;
  undefined8 local_458;
  undefined1 local_450 [16];
  shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
  local_440;
  io_service *local_430;
  basic_streambuf_ref<std::allocator<char>_> local_428;
  undefined1 local_420 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  pointer local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0 [11];
  char acStack_338 [40];
  undefined1 local_310 [5];
  uint3 uStack_30b;
  error_category *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [14];
  undefined1 local_200 [8];
  error_category *local_1f8;
  locale local_1c8 [16];
  pointer local_1b8;
  pointer local_1a8;
  undefined1 local_1a0 [72];
  pointer local_158;
  pointer local_148;
  allocator<char> local_140 [8];
  ios_base local_138 [264];
  
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,*(long *)content,*(long *)(content + 8) + *(long *)content);
  iVar11 = std::__cxx11::string::compare((char *)&local_480);
  if (iVar11 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_480,0,local_478,0x17b937);
  }
  std::ostream::seekp((long)header,_S_beg);
  __val = std::ostream::tellp();
  std::ostream::seekp((long)header,_S_beg);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)local_1a0,0xffffffffffffffff,local_140);
  local_490 = header;
  std::ostream::ostream(local_140,(streambuf *)local_1a0);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_140,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(char *)local_480,(long)local_478);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," HTTP/1.1\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_140,"Host: ",6);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_140,*(char **)((long)&request_type[4].field_2 + 8),
                       (long)request_type[5]._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\r\n",2);
  p_Var13 = *(_Rb_tree_node_base **)(in_R9 + 0x18);
  local_488 = (element_type *)this;
  if (p_Var13 != (_Rb_tree_node_base *)(in_R9 + 8)) {
    do {
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_140,*(char **)(p_Var13 + 1),(long)p_Var13[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,*(char **)(p_Var13 + 2),(long)p_Var13[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\r\n",2);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Rb_tree_node_base *)(in_R9 + 8));
  }
  __p = local_488;
  if (0 < (long)__val) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_140,"Content-Length: ",0x10)
    ;
    __len = 1;
    if (9 < __val) {
      uVar19 = __val;
      uVar9 = 4;
      do {
        __len = uVar9;
        if (uVar19 < 100) {
          __len = __len - 2;
          goto LAB_00154555;
        }
        if (uVar19 < 1000) {
          __len = __len - 1;
          goto LAB_00154555;
        }
        if (uVar19 < 10000) goto LAB_00154555;
        bVar24 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        uVar9 = __len + 4;
      } while (bVar24);
      __len = __len + 1;
    }
LAB_00154555:
    local_420._0_8_ = &local_410;
    std::__cxx11::string::_M_construct((ulong)local_420,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_420._0_8_,__len,__val);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_140,(char *)local_420._0_8_,local_420._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\r\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._0_8_ != &local_410) {
      operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_140,"\r\n",2);
  if (0 < (long)__val) {
    std::ostream::operator<<
              (local_140,
               *(streambuf **)
                ((long)&local_490[4]._M_t._M_impl.super__Rb_tree_header._M_node_count +
                *(long *)(*(long *)&(local_490->_M_t)._M_impl + -0x18)));
  }
  this_00 = (io_service *)&(__p->http_version)._M_string_length;
  (__p->http_version)._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>::Response,std::allocator<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>::Response>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(Response **)__p,
             (allocator<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
              *)local_420);
  local_430 = this_00;
  (**(code **)(request_type->_M_dataplus)._M_p)(request_type);
  local_200 = (undefined1  [8])local_1a0;
  _local_310 = (undefined **)((ulong)uStack_30b << 0x28);
  local_308 = (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_all_t>
            (request_type[4]._M_dataplus._M_p,local_200,local_310,0);
  local_410._8_8_ = local_308;
  _Var7._M_p = (pointer)_local_310;
  if (local_310[4] == true) {
    std::runtime_error::runtime_error((runtime_error *)local_420,"write");
    local_400._M_p = (pointer)local_3f0;
    local_420._0_8_ = &PTR__system_error_00192108;
    local_410._M_allocated_capacity = (size_type)_Var7._M_p;
    local_3f8 = (pointer)0x0;
    local_3f0[0]._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_420);
  }
  local_200 = (undefined1  [8])((long)(__p->http_version)._M_dataplus._M_p + 400);
  _local_310 = (undefined **)((ulong)_local_310 & 0xffffff0000000000);
  local_308 = (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  delim._M_str = "\r\n\r\n";
  delim._M_len = 4;
  sVar14 = boost::asio::
           read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>>
                     ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)request_type[4]._M_dataplus._M_p,
                      (basic_streambuf_ref<std::allocator<char>_> *)local_200,delim,
                      (error_code *)local_310,(type *)0x0);
  local_410._8_8_ = local_308;
  _Var7._M_p = (pointer)_local_310;
  if (local_310[4] == true) {
    std::runtime_error::runtime_error((runtime_error *)local_420,"read_until");
    local_400._M_p = (pointer)local_3f0;
    local_420._0_8_ = &PTR__system_error_00192108;
    local_410._M_allocated_capacity = (size_type)_Var7._M_p;
    local_3f8 = (pointer)0x0;
    local_3f0[0]._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_420);
  }
  local_440.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(__p->http_version)._M_dataplus._M_p;
  local_440.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (((io_service *)&(__p->http_version)._M_string_length)->super_execution_context).
       service_registry_;
  pmVar2 = *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             **)&((local_440.
                   super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->content_buffer).field_0x10;
  lVar3 = *(long *)&((local_440.
                      super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->content_buffer).field_0x28;
  peVar20 = local_440.
            super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((service_registry *)
      local_440.
      super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (service_registry *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (((service_registry *)
       local_440.
       super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock =
           (((service_registry *)
            local_440.
            super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock + 1;
      UNLOCK();
      peVar20 = (element_type *)(__p->http_version)._M_dataplus._M_p;
    }
    else {
      (((service_registry *)
       local_440.
       super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock =
           (((service_registry *)
            local_440.
            super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock + 1;
    }
  }
  parse_response_header
            ((ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)request_type,&local_440,&peVar20->content);
  if ((service_registry *)
      local_440.
      super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (service_registry *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_440.
               super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pp_Var4 = (_func_int **)(__p->http_version)._M_dataplus._M_p;
  paVar22 = &local_410;
  local_420._0_8_ = paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Content-Length","");
  cVar15 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(pp_Var4 + 0x2b),(key_type *)local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._0_8_ != paVar22) {
    operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
  }
  __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)request_type;
  if (cVar15.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_00154879:
    pp_Var4 = (_func_int **)(__p->http_version)._M_dataplus._M_p;
    local_420._0_8_ = paVar22;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Transfer-Encoding","");
    cVar15 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(pp_Var4 + 0x2b),(key_type *)local_420);
    if (cVar15.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      bVar24 = false;
    }
    else {
      pp_Var4 = (_func_int **)(__p->http_version)._M_dataplus._M_p;
      _local_310 = (undefined **)&local_300;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Transfer-Encoding","");
      pmVar16 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(pp_Var4 + 0x2b),(key_type *)local_310);
      iVar11 = std::__cxx11::string::compare((char *)pmVar16);
      bVar24 = iVar11 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_310 != &local_300) {
        operator_delete(_local_310,local_300._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._0_8_ != paVar22) {
      operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
    }
    if (bVar24) {
      boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
                ((basic_streambuf<std::allocator<char>_> *)local_200,0xffffffffffffffff,
                 (allocator<char> *)local_420);
      std::ostream::ostream(local_420,(streambuf *)local_200);
      local_460.sb_ = (basic_streambuf<std::allocator<char>_> *)local_450;
      local_458 = 0;
      local_450[0] = (streambuf)0x0;
      do {
        local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_4c0 & 0xffffff0000000000);
        local_4b8 = (error_category *)
                    &boost::system::detail::cat_holder<void>::system_category_instance;
        local_4a0 = (basic_streambuf<std::allocator<char>_> *)
                    ((long)(__p->http_version)._M_dataplus._M_p + 400);
        delim_00._M_str = "\r\n";
        delim_00._M_len = 2;
        sVar14 = boost::asio::
                 read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>>
                           ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                             *)__nptr[8]._M_allocated_capacity,
                            (basic_streambuf_ref<std::allocator<char>_> *)&local_4a0,delim_00,
                            (error_code *)&local_4c0,(type *)0x0);
        local_300._8_8_ = local_4b8;
        local_300._M_allocated_capacity = (size_type)local_4c0;
        if (local_4c0._4_1_ == true) {
          std::runtime_error::runtime_error((runtime_error *)local_310,"read_until");
          local_2f0._M_p = (pointer)local_2e0;
          _local_310 = &PTR__system_error_00192108;
          local_2e8 = 0;
          local_2e0[0]._M_local_buf[0] = '\0';
          boost::throw_exception<boost::system::system_error>((system_error *)local_310);
        }
        pp_Var4 = (_func_int **)(__p->http_version)._M_dataplus._M_p;
        local_4b8 = (error_category *)0x0;
        local_4b0._M_local_buf[0] = '\0';
        piVar23 = (istream *)(pp_Var4 + 8);
        local_4c0 = &local_4b0;
        cVar10 = std::ios::widen((char)*(undefined8 *)(pp_Var4[8] + -0x18) + (char)piVar23);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (piVar23,(string *)&local_4c0,cVar10);
        peVar5 = local_4b8;
        std::__cxx11::string::pop_back();
        paVar22 = local_4c0;
        piVar18 = __errno_location();
        iVar11 = *piVar18;
        *piVar18 = 0;
        uVar17 = strtoull(paVar22->_M_local_buf,(char **)local_310,0x10);
        __p = local_488;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_310 == paVar22) {
          std::__throw_invalid_argument("stoull");
LAB_00154dca:
          std::__throw_out_of_range("stoull");
LAB_00154dd6:
          peVar5 = local_498;
          bVar6.sb_ = local_4a0;
          std::runtime_error::runtime_error((runtime_error *)local_310,"read");
          local_2f0._M_p = (pointer)local_2e0;
          _local_310 = &PTR__system_error_00192108;
          local_300._M_allocated_capacity = (size_type)bVar6.sb_;
          local_300._8_8_ = peVar5;
          local_2e8 = 0;
          local_2e0[0]._M_local_buf[0] = '\0';
          boost::throw_exception<boost::system::system_error>((system_error *)local_310);
        }
        if (*piVar18 == 0) {
          *piVar18 = iVar11;
        }
        else if (*piVar18 == 0x22) goto LAB_00154dca;
        pp_Var4 = (_func_int **)(local_488->http_version)._M_dataplus._M_p;
        completion_condition.size_ =
             (long)(uVar17 + 2) -
             (long)(pp_Var4[0x37] + (1 - (long)(pp_Var4[0x34] + sVar14)) +
                   (long)&peVar5->_vptr_error_category);
        if (pp_Var4[0x37] + (1 - (long)(pp_Var4[0x34] + sVar14)) +
            (long)&peVar5->_vptr_error_category <= (_func_int *)(uVar17 + 2) &&
            completion_condition.size_ != 0) {
          local_428.sb_ = (basic_streambuf<std::allocator<char>_> *)(pp_Var4 + 0x32);
          local_4a0 = local_4a0 & 0xffffff0000000000;
          local_498 = (error_category *)
                      &boost::system::detail::cat_holder<void>::system_category_instance;
          boost::asio::
          read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_exactly_t>
                    ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)request_type[4]._M_dataplus._M_p,&local_428,completion_condition,
                     (error_code *)&local_4a0,(type *)0x0);
          if (local_4a0._4_1_ == true) goto LAB_00154dd6;
        }
        std::__cxx11::string::resize((ulong)&local_460,(char)uVar17);
        std::istream::read((char *)((long)(__p->http_version)._M_dataplus._M_p + 0x40),
                           (long)local_460.sb_);
        std::ostream::write(local_420,(long)local_460.sb_);
        std::istream::get();
        std::istream::get();
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,
                          CONCAT71(local_4b0._M_allocated_capacity._1_7_,local_4b0._M_local_buf[0])
                          + 1);
        }
        __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)request_type;
      } while (uVar17 != 0);
      std::ostream::ostream
                (local_310,(streambuf *)((long)(__p->http_version)._M_dataplus._M_p + 400));
      std::ostream::operator<<
                (local_310,*(streambuf **)(acStack_338 + (long)*(char **)(local_420._0_8_ - 0x18)));
      std::ios_base::~ios_base((ios_base *)&local_308);
      if (local_460.sb_ != (basic_streambuf<std::allocator<char>_> *)local_450) {
        operator_delete(local_460.sb_,CONCAT71(local_450._1_7_,local_450[0]) + 1);
      }
      std::ios_base::~ios_base((ios_base *)(local_420 + 8));
      local_200 = (undefined1  [8])&PTR__basic_streambuf_00192e30;
      if (local_1b8 != (pointer)0x0) {
        operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      local_200 = (undefined1  [8])__assert_fail;
      std::locale::~locale(local_1c8);
    }
  }
  else {
    s = (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
         *)request_type[4]._M_dataplus._M_p;
    pp_Var4 = (_func_int **)(__p->http_version)._M_dataplus._M_p;
    _local_310 = (undefined **)&local_300;
    local_490 = pmVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Content-Length","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(pp_Var4 + 0x2b),(key_type *)local_310);
    __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pmVar16->_M_dataplus)._M_p;
    __p = (element_type *)__errno_location();
    iVar11 = *(int *)&(__p->http_version)._M_dataplus._M_p;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420;
    *(int *)&(__p->http_version)._M_dataplus._M_p = 0;
    uVar17 = strtoull(__nptr->_M_local_buf,(char **)&paVar22->_M_allocated_capacity,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._0_8_ == __nptr) {
      std::__throw_invalid_argument("stoull");
      goto LAB_00154eed;
    }
    iVar1 = *(int *)&(__p->http_version)._M_dataplus._M_p;
    if (iVar1 == 0) {
      *(int *)&(__p->http_version)._M_dataplus._M_p = iVar11;
    }
    else if (iVar1 == 0x22) {
      std::__throw_out_of_range("stoull");
      goto LAB_00154879;
    }
    local_460.sb_ = (basic_streambuf<std::allocator<char>_> *)(pp_Var4 + 0x32);
    local_200 = (undefined1  [8])((ulong)local_200 & 0xffffff0000000000);
    local_1f8 = (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance
    ;
    boost::asio::
    read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_exactly_t>
              (s,&local_460,(transfer_exactly_t)((long)local_490 + uVar17 + (sVar14 - lVar3)),
               (error_code *)local_200,(type *)0x0);
    __p = local_488;
    if (local_200[4] == true) {
LAB_00154eed:
      peVar5 = local_1f8;
      auVar8 = local_200;
      std::runtime_error::runtime_error((runtime_error *)local_420,"read");
      local_400._M_p = (pointer)local_3f0;
      local_420._0_8_ = &PTR__system_error_00192108;
      local_410._M_allocated_capacity = (size_type)auVar8;
      local_410._8_8_ = peVar5;
      local_3f8 = (pointer)0x0;
      local_3f0[0]._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>((system_error *)local_420);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_310 != &local_300) {
      operator_delete(_local_310,local_300._M_allocated_capacity + 1);
    }
  }
  std::ios_base::~ios_base(local_138);
  local_1a0._0_8_ = &PTR__basic_streambuf_00192e30;
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  local_1a0._0_8_ = __assert_fail;
  std::locale::~locale((locale *)(local_1a0 + 0x38));
  _Var21._M_pi = extraout_RDX;
  if (local_480 != local_470) {
    operator_delete(local_480,local_470[0] + 1);
    _Var21._M_pi = extraout_RDX_00;
  }
  sVar25.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var21._M_pi;
  sVar25.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  return (shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
          )sVar25.
           super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Response> request(const std::string& request_type, const std::string& path, std::ostream& content, 
                const std::map<std::string, std::string>& header=std::map<std::string, std::string>()) {
            std::string corrected_path=path;
            if(corrected_path=="")
                corrected_path="/";
            
            content.seekp(0, std::ios::end);
            long content_length = content.tellp();
            content.seekp(0, std::ios::beg);
            
            boost::asio::streambuf write_buffer;
            std::ostream write_stream(&write_buffer);
            write_stream << request_type << " " << corrected_path << " HTTP/1.1\r\n";
            write_stream << "Host: " << host << "\r\n";
            for(auto& h: header) {
                write_stream << h.first << ": " << h.second << "\r\n";
            }
            if(content_length>0)
                write_stream << "Content-Length: " << std::to_string(content_length) << "\r\n";
            write_stream << "\r\n";
            if(content_length>0)
                write_stream << content.rdbuf();
            
            //std::shared_ptr<Response> response(new Response());
            auto response(std::make_shared<Response>());
            
            try {
                connect();
                
                boost::asio::write(*socket, write_buffer);

                auto bytes_transferred = boost::asio::read_until(*socket, response->content_buffer, "\r\n\r\n");

                size_t num_additional_bytes = response->content_buffer.size()-bytes_transferred;

                parse_response_header(response, response->content);
                                
                if(response->header.count("Content-Length")>0) {
                    boost::asio::read(*socket, response->content_buffer, 
                            boost::asio::transfer_exactly(stoull(response->header["Content-Length"])-num_additional_bytes));
                }
                else if(response->header.count("Transfer-Encoding")>0 && response->header["Transfer-Encoding"]=="chunked") {
                    boost::asio::streambuf streambuf;
                    std::ostream contentLocal(&streambuf);
                    
                    size_t length;
                    std::string buffer;
                    do {
                        auto bytes_transferredLocal = boost::asio::read_until(*socket, response->content_buffer, "\r\n");
                        std::string line;
                        getline(response->content, line);
                        bytes_transferredLocal -= line.size()+1;
                        line.pop_back();
                        length=stoull(line, 0, 16);

                        size_t num_additional_bytesLocal = response->content_buffer.size()-bytes_transferredLocal;
                    
                        if((2+length) > num_additional_bytesLocal) {
                            boost::asio::read(*socket, response->content_buffer, 
                                boost::asio::transfer_exactly(
									2+length-num_additional_bytesLocal)
								);
                        }
                                                
                        buffer.resize(static_cast<size_t>(length));
                        response->content.read(&buffer[0], 
							static_cast<std::streamsize>(length)
						);
                        contentLocal.write(&buffer[0], 
							static_cast<std::streamsize>(length)
						);

                        //Remove "\r\n"
                        response->content.get();
                        response->content.get();
                    } while(length>0);
                    
                    std::ostream response_content_output_stream(&response->content_buffer);
                    response_content_output_stream << contentLocal.rdbuf();
                }
            }
            catch(const std::exception& e) {
                socket_error=true;
                throw std::invalid_argument(e.what());
            }
            
            return response;
        }